

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::post_timestep(PeleLM *this,int crse_iteration)

{
  Amr *pAVar1;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var2;
  pointer puVar3;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var4;
  MultiFab *S_crse;
  MultiFab *S_fine;
  mapped_type *pmVar5;
  uint uVar6;
  ulong uVar7;
  allocator local_5d;
  int local_5c;
  double local_58;
  key_type local_50;
  
  NavierStokesBase::post_timestep(&this->super_NavierStokesBase,crse_iteration);
  if ((plot_reactions == true) && ((this->super_NavierStokesBase).super_AmrLevel.level == 0)) {
    std::__cxx11::string::string((string *)&local_50,"REACTIONS",&local_5d);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
             ::operator[](&this->auxDiag,&local_50);
    local_5c = *(int *)((long)&(((pmVar5->_M_t).
                                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                 .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                               super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0xcc);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 1.0 / (anonymous_namespace)::crse_dt;
    for (uVar6 = *(uint *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
                           super_AmrMesh.super_AmrInfo.field_0x8c;
        pAVar1 = (this->super_NavierStokesBase).super_AmrLevel.parent, -1 < (int)uVar6;
        uVar6 = uVar6 - 1) {
      _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (pAVar1->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      std::__cxx11::string::string((string *)&local_50,"REACTIONS",&local_5d);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                             *)((long)_Var2.
                                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl
                               + 0x1908),&local_50);
      amrex::MultiFab::mult
                ((pmVar5->_M_t).
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,local_58,0);
      std::__cxx11::string::~string((string *)&local_50);
    }
    for (uVar7 = (ulong)*(uint *)&(pAVar1->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
        0 < (int)uVar7; uVar7 = uVar7 - 1) {
      puVar3 = (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           puVar3[uVar7 - 1]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      _Var4.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           puVar3[uVar7]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      std::__cxx11::string::string((string *)&local_50,"REACTIONS",&local_5d);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                             *)((((NavierStokesBase *)
                                 ((long)_Var2.
                                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                        _M_head_impl + 0x1748))->super_AmrLevel).m_AreaNotToTag.
                                m_bat.m_op.m_bndryReg.m_doilo.vect + 2),&local_50);
      S_crse = (pmVar5->_M_t).
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_50,"REACTIONS",&local_5d);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                             *)((long)_Var4.
                                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl
                               + 0x1908),&local_50);
      S_fine = (pmVar5->_M_t).
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      std::__cxx11::string::~string((string *)&local_50);
      NavierStokesBase::average_down
                ((NavierStokesBase *)
                 _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                 super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,S_fine,S_crse,0,
                 local_5c);
    }
  }
  return;
}

Assistant:

void
PeleLM::post_timestep (int crse_iteration)
{
  BL_PROFILE("PLM::post_timestep()");

  NavierStokesBase::post_timestep(crse_iteration);

  if (plot_reactions && level == 0)
  {
    const int Ndiag = auxDiag["REACTIONS"]->nComp();
    //
    // Multiply by the inverse of the coarse timestep.
    //
    const Real factor = 1.0 / crse_dt;

    for (int i = parent->finestLevel(); i >= 0; --i)
      getLevel(i).auxDiag["REACTIONS"]->mult(factor);

    for (int i = parent->finestLevel(); i > 0; --i)
    {
      PeleLM& clev = getLevel(i-1);
      PeleLM& flev = getLevel(i);

      MultiFab& Ydot_crse = *(clev.auxDiag["REACTIONS"]);
      MultiFab& Ydot_fine = *(flev.auxDiag["REACTIONS"]);

      clev.average_down(Ydot_fine, Ydot_crse, 0, Ndiag);
    }
  }
}